

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

void nn_pipebase_getopt(nn_pipebase *self,int level,int option,void *optval,size_t *optvallen)

{
  uint uVar1;
  int extraout_EDX;
  size_t __n;
  int socktype;
  ulong uVar2;
  int intval;
  int local_c;
  
  if (level != 0) {
    uVar1 = nn_sock_getopt_inner(self->sock,level,option,optval,optvallen);
    if (uVar1 == 0) {
      return;
    }
    self = (nn_pipebase *)(ulong)uVar1;
    nn_pipebase_getopt_cold_1();
    option = extraout_EDX;
  }
  if (option == 0xe) {
    local_c = (self->options).ipv4only;
  }
  else if (option == 9) {
    local_c = (self->options).rcvprio;
  }
  else {
    if (option != 8) {
      socktype = 0;
      uVar1 = nn_sock_getopt_inner(self->sock,0,option,optval,optvallen);
      if (uVar1 == 0) {
        return;
      }
      uVar2 = (ulong)uVar1;
      nn_pipebase_getopt_cold_2();
      nn_sock_ispeer(*(nn_sock **)(uVar2 + 0x68),socktype);
      return;
    }
    local_c = (self->options).sndprio;
  }
  __n = 4;
  if (*optvallen < 4) {
    __n = *optvallen;
  }
  memcpy(optval,&local_c,__n);
  *optvallen = 4;
  return;
}

Assistant:

void nn_pipebase_getopt (struct nn_pipebase *self, int level, int option,
    void *optval, size_t *optvallen)
{
    int rc;
    int intval;

    if (level == NN_SOL_SOCKET) {
        switch (option) {

        /*  Endpoint options  */
        case NN_SNDPRIO:
            intval = self->options.sndprio;
            break;
        case NN_RCVPRIO:
            intval = self->options.rcvprio;
            break;
        case NN_IPV4ONLY:
            intval = self->options.ipv4only;
            break;

        /*  Fallback to socket options  */
        default:
            rc = nn_sock_getopt_inner (self->sock, level,
                option, optval, optvallen);
            errnum_assert (rc == 0, -rc);
            return;
        }

        memcpy (optval, &intval,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);

        return;
    }

    rc = nn_sock_getopt_inner (self->sock, level, option, optval, optvallen);
    errnum_assert (rc == 0, -rc);
}